

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportInstallFileGenerator::InstallNameDir
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,
          cmGeneratorTarget *target,string *config)

{
  string *config_00;
  string *this_00;
  bool bVar1;
  cmMakefile *this_01;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  allocator<char> local_69;
  string local_68;
  cmMakefile *local_38;
  cmMakefile *mf;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmExportInstallFileGenerator *this_local;
  string *install_name_dir;
  
  mf._7_1_ = 0;
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmExportInstallFileGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_01 = cmTarget::GetMakefile(*(cmTarget **)config_local);
  local_38 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_69);
  bVar1 = cmMakefile::IsOn(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  this_00 = config_local;
  config_00 = local_28;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"${_IMPORT_PREFIX}",&local_b1);
    cmGeneratorTarget::GetInstallNameDirForInstallTree
              (&local_90,(cmGeneratorTarget *)this_00,config_00,&local_b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::InstallNameDir(
  cmGeneratorTarget const* target, const std::string& config)
{
  std::string install_name_dir;

  cmMakefile* mf = target->Target->GetMakefile();
  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    install_name_dir =
      target->GetInstallNameDirForInstallTree(config, "${_IMPORT_PREFIX}");
  }

  return install_name_dir;
}